

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<vec<Clause_*>_>::push(vec<vec<Clause_*>_> *this)

{
  uint uVar1;
  void *pvVar2;
  uint *in_RDI;
  uint local_14;
  
  if (*in_RDI == in_RDI[1]) {
    if (in_RDI[1] < 2) {
      local_14 = 2;
    }
    else {
      local_14 = in_RDI[1] * 3 + 1 >> 1;
    }
    in_RDI[1] = local_14;
    pvVar2 = realloc(*(void **)(in_RDI + 2),(ulong)in_RDI[1] << 4);
    *(void **)(in_RDI + 2) = pvVar2;
  }
  uVar1 = *in_RDI;
  *in_RDI = uVar1 + 1;
  vec<Clause_*>::vec((vec<Clause_*> *)(*(long *)(in_RDI + 2) + (ulong)uVar1 * 0x10));
  return;
}

Assistant:

void push() {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T();
	}